

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::processDisconnect(CoreBroker *this,bool skipUnregister)

{
  __int_type_conflict _Var1;
  byte in_SIL;
  CoreBroker *in_RDI;
  CoreBroker *in_stack_00000020;
  BrokerState cBrokerState;
  bool in_stack_0000010b;
  int in_stack_0000010c;
  BrokerBase *in_stack_00000110;
  undefined1 in_stack_00000118 [16];
  GlobalFederateId in_stack_0000012c;
  string_view in_stack_00000250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  BrokerBase *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  GlobalFederateId local_10;
  BrokerState local_c;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_c = BrokerBase::getBrokerState((BrokerBase *)0x5f98f5);
  if (local_c < TERMINATING) {
    if (CONFIGURED < local_c) {
      _Var1 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)in_stack_ffffffffffffffb8);
      if (8 < _Var1) {
        in_stack_ffffffffffffffb8 = &in_RDI->super_BrokerBase;
        GlobalFederateId::GlobalFederateId(&local_10,(GlobalBrokerId)0x0);
        getIdentifier_abi_cxx11_(in_RDI);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffffb0);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,
                   (char *)in_stack_ffffffffffffffb8);
        BrokerBase::sendToLogger
                  (in_stack_00000110,in_stack_0000012c,in_stack_0000010c,
                   (string_view)in_stack_00000118,in_stack_00000250,in_stack_0000010b);
        in_stack_ffffffffffffffb0 = local_30;
      }
      BrokerBase::setBrokerState
                (in_stack_ffffffffffffffb8,(BrokerState)((ulong)in_stack_ffffffffffffffb0 >> 0x30));
      (*(in_RDI->super_Broker)._vptr_Broker[0x21])();
    }
    BrokerBase::setBrokerState
              (in_stack_ffffffffffffffb8,(BrokerState)((ulong)in_stack_ffffffffffffffb0 >> 0x30));
    if ((local_9 & 1) == 0) {
      unregister(in_stack_00000020);
    }
    gmlc::concurrency::TriggerVariable::trigger((TriggerVariable *)in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void CoreBroker::processDisconnect(bool skipUnregister)
{
    auto cBrokerState = getBrokerState();
    if (cBrokerState >= BrokerState::TERMINATING) {
        return;
    }
    if (cBrokerState > BrokerState::CONFIGURED) {
        LOG_CONNECTIONS(parent_broker_id, getIdentifier(), "||disconnecting");
        setBrokerState(BrokerState::TERMINATING);
        brokerDisconnect();
    }
    setBrokerState(BrokerState::TERMINATED);

    if (!skipUnregister) {
        unregister();
    }
    disconnection.trigger();
}